

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ticker.h
# Opt level: O1

void * __thiscall
snmalloc::Ticker<snmalloc::PALLinux>::check_tick_slow<void*>
          (Ticker<snmalloc::PALLinux> *this,void *p)

{
  uint64_t time_ms;
  uint64_t uVar1;
  ulong uVar2;
  
  time_ms = PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::internal_time_in_ms();
  PalTimer::check(&PalTimerDefaultImpl<snmalloc::PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>_>::
                   timers,time_ms);
  uVar1 = this->last_query_ms;
  this->last_query_ms = time_ms;
  if (uVar1 == 0) {
    uVar1 = 1;
    this->count_down = 1;
  }
  else {
    uVar2 = time_ms - uVar1;
    if (uVar2 != 0) {
      uVar2 = (this->counted * 0x32 + 0x32) / uVar2;
      this->counted = uVar2;
      this->count_down = uVar2;
      return p;
    }
    this->count_down = this->counted;
    uVar1 = this->counted * 2;
  }
  this->counted = uVar1;
  return p;
}

Assistant:

SNMALLOC_SLOW_PATH T check_tick_slow(T p = nullptr)
    {
      uint64_t now_ms = PAL::time_in_ms();

      // Set up clock.
      if (last_query_ms == 0)
      {
        last_query_ms = now_ms;
        count_down = 1;
        counted = 1;
        return p;
      }

      uint64_t duration_ms = now_ms - last_query_ms;
      last_query_ms = now_ms;

      // Check is below clock resolution
      if (duration_ms == 0)
      {
        // Exponential back off
        count_down = counted;
        counted *= 2;
        return p;
      }

      constexpr size_t deadline_in_ms = 50;

      // Estimate number of ticks to get to the new deadline, based on the
      // current interval
      auto new_deadline_in_ticks =
        ((1 + counted) * deadline_in_ms) / duration_ms;

      counted = new_deadline_in_ticks;
      count_down = new_deadline_in_ticks;

      return p;
    }